

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# change-base.c
# Opt level: O0

size_t change_base(uint8_t *num,uint8_t from,uint8_t to,uint8_t *target)

{
  undefined1 auVar1 [16];
  ulong local_50;
  size_t n_1;
  size_t n;
  size_t res;
  uint64_t mul;
  uint64_t sum;
  uint8_t *target_local;
  uint8_t to_local;
  uint8_t from_local;
  uint8_t *num_local;
  
  if ((((from < 2) || (10 < from)) || (to < 2)) || (10 < to)) {
    num_local = (uint8_t *)0xffffffffffffffff;
  }
  else {
    mul = 0;
    res = 1;
    n = 0xffffffffffffffff;
    for (n_1 = 0; n_1 < 0x40; n_1 = n_1 + 1) {
      if (from <= num[n_1]) {
        return 0xffffffffffffffff;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = res;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < (ulong)num[n_1]) {
        return 0xffffffffffffffff;
      }
      if (-mul - 1 <= num[n_1] * res && num[n_1] * res - (-mul - 1) != 0) {
        return 0xffffffffffffffff;
      }
      mul = num[n_1] * res + mul;
      res = from * res;
    }
    for (local_50 = 0; local_50 < 0x40; local_50 = local_50 + 1) {
      target[local_50] = (uint8_t)(mul % (ulong)to);
      mul = mul / to;
      if ((mul == 0) && (n == 0xffffffffffffffff)) {
        n = local_50;
      }
    }
    num_local = (uint8_t *)n;
  }
  return (size_t)num_local;
}

Assistant:

size_t change_base(const uint8_t num[WIDTH], const uint8_t from, const uint8_t to, uint8_t* target) {
  if (from <= 1 || from > 10 || to <= 1 || to > 10) return (size_t)(-1);

  uint64_t sum = 0;
  uint64_t mul = 1;
  size_t res = (size_t)(-1);

  for (size_t n = 0; n < WIDTH; n++, mul *= from) {
    if (num[n] >= from) return (size_t)(-1);
    // overflow protection
    if (num[n] > UINT64_MAX / mul) return (size_t)(-1);
    if (num[n] * mul > UINT64_MAX - sum) return (size_t)(-1);
    sum += num[n] * mul;
  }

  for (size_t n = 0; n < WIDTH; n++) {
    target[n] = sum % to;
    sum /= to;
    if (sum == 0 && res == (size_t)(-1)) res = n;
  }

  return res;
}